

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator^(sc_signed *u,sc_signed *v)

{
  long in_RDX;
  long in_RSI;
  sc_signed *in_RDI;
  small_type in_stack_00000024;
  sc_digit *in_stack_00000028;
  int in_stack_00000050;
  int in_stack_00000058;
  sc_digit *in_stack_00000060;
  
  if (*(int *)(in_RDX + 8) == 0) {
    sc_signed::sc_signed(in_RDI,in_RDI);
  }
  else if (*(int *)(in_RSI + 8) == 0) {
    sc_signed::sc_signed(in_RDI,in_RDI);
  }
  else {
    xor_signed_friend(u._4_4_,(int)u,v._4_4_,in_stack_00000028,in_stack_00000024,in_stack_00000050,
                      in_stack_00000058,in_stack_00000060);
  }
  return in_RDI;
}

Assistant:

sc_signed
operator^(const sc_signed& u, const sc_signed& v)
{

  if (v.sgn == SC_ZERO)  // case 1
    return sc_signed(u);

  if (u.sgn == SC_ZERO)  // case 2
    return sc_signed(v);

  // other cases
  return xor_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}